

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ee75c3::av1_inv_txfm1d_round_trip_Test::TestBody
          (av1_inv_txfm1d_round_trip_Test *this)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  AssertionResult gtest_ar_1;
  int node_err;
  int ni_1;
  int ni;
  AssertionResult gtest_ar;
  int32_t round_trip_output [64];
  int32_t output [64];
  int32_t input [64];
  int i;
  int count_test_block;
  int max_error;
  TxfmFunc inv_txfm_func;
  TxfmFunc fwd_txfm_func;
  int ti;
  int txfm_size;
  int si;
  ACMRandom rnd;
  int in_stack_fffffffffffffc3c;
  AssertHelper *in_stack_fffffffffffffc40;
  int *in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc50;
  uint in_stack_fffffffffffffc54;
  char *in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  Type in_stack_fffffffffffffc6c;
  AssertHelper *in_stack_fffffffffffffc70;
  int local_37c;
  int local_378;
  Message *in_stack_fffffffffffffcb8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffcc0;
  int local_338 [64];
  undefined1 local_238 [256];
  int local_138 [65];
  int local_34;
  undefined4 local_30;
  undefined4 local_2c;
  code *local_28;
  code *local_20;
  int local_18;
  int local_14;
  int local_10;
  
  libaom_test::ACMRandom::DeterministicSeed();
  libaom_test::ACMRandom::ACMRandom
            ((ACMRandom *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  local_10 = 0;
  do {
    if (4 < local_10) {
      return;
    }
    local_14 = *(int *)((anonymous_namespace)::txfm_size_ls + (long)local_10 * 4);
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      local_20 = *(code **)((anonymous_namespace)::fwd_txfm_func_ls +
                           (long)local_18 * 8 + (long)local_10 * 0x10);
      local_28 = *(code **)((anonymous_namespace)::inv_txfm_func_ls +
                           (long)local_18 * 8 + (long)local_10 * 0x10);
      local_2c = 2;
      if (local_20 != (code *)0x0) {
        local_30 = 5000;
        for (local_34 = 0; local_34 < 5000; local_34 = local_34 + 1) {
          testing::internal::CmpHelperLE<int,int>
                    (in_stack_fffffffffffffc58,
                     (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     in_stack_fffffffffffffc48,(int *)in_stack_fffffffffffffc40);
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffcb8);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffc70);
            in_stack_fffffffffffffc58 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x9db035);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,in_stack_fffffffffffffc60
                       ,(int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)in_stack_fffffffffffffcc0._M_head_impl,
                       in_stack_fffffffffffffcb8);
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc40);
            testing::Message::~Message((Message *)0x9db083);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x9db0ec);
          if (!bVar1) {
            return;
          }
          for (local_378 = 0; local_378 < local_14; local_378 = local_378 + 1) {
            uVar2 = libaom_test::ACMRandom::Rand16((ACMRandom *)in_stack_fffffffffffffc40);
            in_stack_fffffffffffffc54 = (uint)uVar2 % 0x400;
            uVar2 = libaom_test::ACMRandom::Rand16((ACMRandom *)in_stack_fffffffffffffc40);
            local_138[local_378] = in_stack_fffffffffffffc54 - (uint)uVar2 % 0x400;
          }
          (*local_20)(local_138,local_238,0xd,(anonymous_namespace)::range_bit);
          (*local_28)(local_238,local_338,0xd,(anonymous_namespace)::range_bit);
          for (local_37c = 0; local_37c < local_14; local_37c = local_37c + 1) {
            in_stack_fffffffffffffc50 = local_138[local_37c];
            in_stack_fffffffffffffc48 = (int *)(long)local_338[local_37c];
            iVar3 = get_max_bit(local_14);
            ::round_shift((int64_t)in_stack_fffffffffffffc48,iVar3 + -1);
            testing::internal::CmpHelperLE<int,int>
                      (in_stack_fffffffffffffc58,
                       (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                       in_stack_fffffffffffffc48,(int *)in_stack_fffffffffffffc40);
            bVar1 = testing::AssertionResult::operator_cast_to_bool
                              ((AssertionResult *)&stack0xfffffffffffffc70);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffc70);
              in_stack_fffffffffffffc40 =
                   (AssertHelper *)
                   testing::AssertionResult::failure_message((AssertionResult *)0x9db27c);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                         in_stack_fffffffffffffc60,(int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                         (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)in_stack_fffffffffffffcc0._M_head_impl,
                         in_stack_fffffffffffffcb8);
              testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc40);
              testing::Message::~Message((Message *)0x9db2ca);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x9db31a);
          }
        }
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

TEST(av1_inv_txfm1d, round_trip) {
  ACMRandom rnd(ACMRandom::DeterministicSeed());
  for (int si = 0; si < NELEMENTS(fwd_txfm_func_ls); ++si) {
    int txfm_size = txfm_size_ls[si];

    for (int ti = 0; ti < txfm_type_num; ++ti) {
      TxfmFunc fwd_txfm_func = fwd_txfm_func_ls[si][ti];
      TxfmFunc inv_txfm_func = inv_txfm_func_ls[si][ti];
      int max_error = 2;

      if (!fwd_txfm_func) continue;

      const int count_test_block = 5000;
      for (int i = 0; i < count_test_block; ++i) {
        int32_t input[64];
        int32_t output[64];
        int32_t round_trip_output[64];

        ASSERT_LE(txfm_size, NELEMENTS(input));

        for (int ni = 0; ni < txfm_size; ++ni) {
          input[ni] = rnd.Rand16() % input_base - rnd.Rand16() % input_base;
        }

        fwd_txfm_func(input, output, cos_bit, range_bit);
        inv_txfm_func(output, round_trip_output, cos_bit, range_bit);

        for (int ni = 0; ni < txfm_size; ++ni) {
          int node_err =
              abs(input[ni] - round_shift(round_trip_output[ni],
                                          get_max_bit(txfm_size) - 1));
          EXPECT_LE(node_err, max_error);
        }
      }
    }
  }
}